

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

bool LowererMD::HoistLargeConstant(IndirOpnd *indirOpnd,Opnd *src,Instr *instr)

{
  RegOpnd *dst;
  
  if (indirOpnd != (IndirOpnd *)0x0) {
    if (indirOpnd->m_offset == 0) {
      dst = indirOpnd->m_baseOpnd;
    }
    else {
      dst = IR::RegOpnd::New(TyUint64,instr->m_func);
      Lowerer::InsertLea(dst,&indirOpnd->super_Opnd,instr);
    }
    IR::Instr::ReplaceSrc(instr,src,&dst->super_Opnd);
  }
  return indirOpnd != (IndirOpnd *)0x0;
}

Assistant:

bool LowererMD::HoistLargeConstant(IR::IndirOpnd *indirOpnd, IR::Opnd *src, IR::Instr *instr) {
        if (indirOpnd != nullptr)
        {
            if (indirOpnd->GetOffset() == 0)
            {
                instr->ReplaceSrc(src, indirOpnd->GetBaseOpnd());
            }
            else
            {
                // Hoist the address load as LEA [reg + offset]
                // with the reg = MOV <some address within 32-bit range at the start of the function
                IR::RegOpnd * regOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
                Lowerer::InsertLea(regOpnd, indirOpnd, instr);
                instr->ReplaceSrc(src, regOpnd);
            }
            return true;
        }
        return false;
}